

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfdrivr.c
# Opt level: O0

FT_UInt bdf_cmap_char_next(FT_CMap bdfcmap,FT_UInt32 *acharcode)

{
  long lVar1;
  ulong uVar2;
  FT_Face pFVar3;
  FT_ULong code;
  FT_ULong charcode;
  FT_UShort result;
  FT_ULong mid;
  FT_ULong max;
  FT_ULong min;
  BDF_encoding_el *encodings;
  BDF_CMap cmap;
  FT_UInt32 *acharcode_local;
  FT_CMap bdfcmap_local;
  
  lVar1 = *(long *)&bdfcmap[1].charmap.encoding;
  charcode._6_2_ = 0;
  code = (FT_ULong)(*acharcode + 1);
  max = 0;
  pFVar3 = bdfcmap[1].charmap.face;
  do {
    mid = (FT_ULong)pFVar3;
    if (mid <= max) {
      code = 0;
      if (max < bdfcmap[1].charmap.face) {
        code = *(FT_ULong *)(lVar1 + max * 0x10);
        charcode._6_2_ = *(short *)(lVar1 + max * 0x10 + 8) + 1;
      }
LAB_00155d18:
      if (code < 0x100000000) {
        *acharcode = (FT_UInt32)code;
      }
      else {
        *acharcode = 0;
      }
      return (FT_UInt)charcode._6_2_;
    }
    pFVar3 = (FT_Face)(max + mid >> 1);
    uVar2 = *(ulong *)(lVar1 + (long)pFVar3 * 0x10);
    if (code == uVar2) {
      charcode._6_2_ = *(short *)(lVar1 + (long)pFVar3 * 0x10 + 8) + 1;
      goto LAB_00155d18;
    }
    if (uVar2 <= code) {
      max = (long)pFVar3 + 1;
      pFVar3 = (FT_Face)mid;
    }
  } while( true );
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  bdf_cmap_char_next( FT_CMap     bdfcmap,
                      FT_UInt32  *acharcode )
  {
    BDF_CMap          cmap      = (BDF_CMap)bdfcmap;
    BDF_encoding_el*  encodings = cmap->encodings;
    FT_ULong          min, max, mid; /* num_encodings */
    FT_UShort         result   = 0;  /* encodings->glyph */
    FT_ULong          charcode = *acharcode + 1;


    min = 0;
    max = cmap->num_encodings;

    while ( min < max )
    {
      FT_ULong  code; /* same as BDF_encoding_el.enc */


      mid  = ( min + max ) >> 1;
      code = (FT_ULong)encodings[mid].enc;

      if ( charcode == code )
      {
        /* increase glyph index by 1 --              */
        /* we reserve slot 0 for the undefined glyph */
        result = encodings[mid].glyph + 1;
        goto Exit;
      }

      if ( charcode < code )
        max = mid;
      else
        min = mid + 1;
    }

    charcode = 0;
    if ( min < cmap->num_encodings )
    {
      charcode = (FT_ULong)encodings[min].enc;
      result   = encodings[min].glyph + 1;
    }

  Exit:
    if ( charcode > 0xFFFFFFFFUL )
    {
      FT_TRACE1(( "bdf_cmap_char_next: charcode 0x%x > 32bit API" ));
      *acharcode = 0;
      /* XXX: result should be changed to indicate an overflow error */
    }
    else
      *acharcode = (FT_UInt32)charcode;
    return result;
  }